

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int yaml_parser_parse_node
              (yaml_parser_t *parser,yaml_event_t *event,int block,int indentless_sequence)

{
  yaml_mark_t *pyVar1;
  yaml_token_type_t yVar2;
  yaml_parser_state_t *pyVar3;
  size_t sVar4;
  yaml_tag_directive_t *pyVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  size_t __n;
  size_t __n_00;
  yaml_char_t *__dest;
  yaml_char_t *pyVar9;
  byte bVar10;
  char *pcVar11;
  uint uVar12;
  yaml_version_directive_t *ptr;
  yaml_tag_directive_t *pyVar13;
  yaml_token_t *pyVar14;
  yaml_char_t *local_c8;
  yaml_char_t *local_c0;
  yaml_mark_t end_mark;
  yaml_mark_t start_mark;
  yaml_mark_t tag_mark;
  
  if (((parser->token_available == 0) && (iVar8 = yaml_parser_fetch_more_tokens(parser), iVar8 == 0)
      ) || (pyVar14 = (parser->tokens).head, pyVar14 == (yaml_token_t *)0x0)) {
LAB_0010bcbf:
    iVar8 = 0;
  }
  else {
    yVar2 = pyVar14->type;
    if (yVar2 == YAML_ALIAS_TOKEN) {
      pyVar3 = (parser->states).top;
      (parser->states).top = pyVar3 + -1;
      parser->state = pyVar3[-1];
      *(undefined8 *)event = 0;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->end_mark).index = 0;
      (event->end_mark).line = 0;
      (event->start_mark).line = 0;
      (event->start_mark).column = 0;
      *(undefined8 *)((long)&event->data + 0x28) = 0;
      (event->start_mark).index = 0;
      (event->end_mark).column = 0;
      (event->data).scalar.length = 0;
      *(undefined8 *)((long)&event->data + 0x20) = 0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
      event->type = YAML_ALIAS_EVENT;
      (event->start_mark).column = (pyVar14->start_mark).column;
      sVar4 = (pyVar14->start_mark).line;
      (event->start_mark).index = (pyVar14->start_mark).index;
      (event->start_mark).line = sVar4;
      sVar4 = (pyVar14->end_mark).line;
      (event->end_mark).index = (pyVar14->end_mark).index;
      (event->end_mark).line = sVar4;
      (event->end_mark).column = (pyVar14->end_mark).column;
      (event->data).document_start.version_directive =
           (yaml_version_directive_t *)(pyVar14->data).alias.value;
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      pyVar14 = (parser->tokens).head;
      parser->stream_end_produced = (uint)(pyVar14->type == YAML_STREAM_END_TOKEN);
      (parser->tokens).head = pyVar14 + 1;
    }
    else {
      uVar12 = 1;
      pyVar1 = &pyVar14->start_mark;
      end_mark.column = (pyVar14->start_mark).column;
      end_mark.index = (pyVar14->start_mark).index;
      end_mark.line = (pyVar14->start_mark).line;
      start_mark.index = (pyVar14->start_mark).index;
      start_mark.line = (pyVar14->start_mark).line;
      start_mark.column = (pyVar14->start_mark).column;
      if (yVar2 == YAML_TAG_TOKEN) {
        local_c0 = (pyVar14->data).tag.handle;
        local_c8 = (pyVar14->data).tag.suffix;
        tag_mark.column = (pyVar14->start_mark).column;
        tag_mark.index = pyVar1->index;
        tag_mark.line = (pyVar14->start_mark).line;
        start_mark.column = (pyVar14->start_mark).column;
        start_mark.index = pyVar1->index;
        start_mark.line = (pyVar14->start_mark).line;
        end_mark.column = (pyVar14->end_mark).column;
        end_mark.index = (pyVar14->end_mark).index;
        end_mark.line = (pyVar14->end_mark).line;
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        parser->stream_end_produced = 0;
        (parser->tokens).head = pyVar14 + 1;
        iVar8 = yaml_parser_fetch_more_tokens(parser);
        if ((iVar8 != 0) && (pyVar14 = (parser->tokens).head, pyVar14 != (yaml_token_t *)0x0)) {
          if (pyVar14->type == YAML_ANCHOR_TOKEN) {
            ptr = (yaml_version_directive_t *)(pyVar14->data).tag.handle;
            end_mark.column = (pyVar14->end_mark).column;
            end_mark.index = (pyVar14->end_mark).index;
            end_mark.line = (pyVar14->end_mark).line;
            parser->token_available = 0;
            parser->tokens_parsed = parser->tokens_parsed + 1;
            parser->stream_end_produced = 0;
            (parser->tokens).head = pyVar14 + 1;
            iVar8 = yaml_parser_fetch_more_tokens(parser);
            if ((iVar8 == 0) || (pyVar14 = (parser->tokens).head, pyVar14 == (yaml_token_t *)0x0))
            goto LAB_0010bc9a;
          }
          else {
            ptr = (yaml_version_directive_t *)0x0;
          }
LAB_0010bce4:
          uVar12 = 1;
          if (local_c0 == (yaml_char_t *)0x0) {
            bVar10 = 0;
            __dest = (yaml_char_t *)0x0;
          }
          else {
            if (*local_c0 != '\0') {
              pyVar5 = (parser->tag_directives).top;
              for (pyVar13 = (parser->tag_directives).start; pyVar13 != pyVar5;
                  pyVar13 = pyVar13 + 1) {
                iVar8 = strcmp((char *)pyVar13->handle,(char *)local_c0);
                if (iVar8 == 0) {
                  __n = strlen((char *)pyVar13->prefix);
                  __n_00 = strlen((char *)local_c8);
                  __dest = (yaml_char_t *)yaml_malloc(__n_00 + __n + 1);
                  if (__dest != (yaml_char_t *)0x0) {
                    memcpy(__dest,pyVar13->prefix,__n);
                    memcpy(__dest + __n,local_c8,__n_00);
                    __dest[__n_00 + __n] = '\0';
                    yaml_free(local_c0);
                    yaml_free(local_c8);
                    goto LAB_0010c075;
                  }
                  parser->error = YAML_MEMORY_ERROR;
                  goto LAB_0010bc9a;
                }
              }
              parser->error = YAML_PARSER_ERROR;
              parser->context = "while parsing a node";
              (parser->context_mark).index = start_mark.index;
              (parser->context_mark).line = start_mark.line;
              (parser->context_mark).column = start_mark.column;
              parser->problem = "found undefined tag handle";
              (parser->problem_mark).index = tag_mark.index;
              (parser->problem_mark).line = tag_mark.line;
              (parser->problem_mark).column = tag_mark.column;
              goto LAB_0010bc9a;
            }
            yaml_free(local_c0);
            __dest = local_c8;
            if (local_c8 == (yaml_char_t *)0x0) goto LAB_0010bcca;
LAB_0010c075:
            uVar12 = (uint)(*__dest == '\0');
            bVar10 = 1;
            local_c8 = (yaml_char_t *)0x0;
          }
          goto LAB_0010bb97;
        }
        ptr = (yaml_version_directive_t *)0x0;
LAB_0010bc9a:
        __dest = (yaml_char_t *)0x0;
LAB_0010bc9f:
        yaml_free(ptr);
        yaml_free(local_c0);
        yaml_free(local_c8);
        yaml_free(__dest);
        goto LAB_0010bcbf;
      }
      if (yVar2 == YAML_ANCHOR_TOKEN) {
        ptr = (yaml_version_directive_t *)(pyVar14->data).tag.handle;
        start_mark.column = (pyVar14->start_mark).column;
        start_mark.index = pyVar1->index;
        start_mark.line = (pyVar14->start_mark).line;
        end_mark.column = (pyVar14->end_mark).column;
        end_mark.index = (pyVar14->end_mark).index;
        end_mark.line = (pyVar14->end_mark).line;
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        parser->stream_end_produced = 0;
        (parser->tokens).head = pyVar14 + 1;
        iVar8 = yaml_parser_fetch_more_tokens(parser);
        if ((iVar8 == 0) || (pyVar14 = (parser->tokens).head, pyVar14 == (yaml_token_t *)0x0)) {
          local_c8 = (yaml_char_t *)0x0;
          __dest = (yaml_char_t *)0x0;
          local_c0 = (yaml_char_t *)0x0;
          goto LAB_0010bc9f;
        }
        if (pyVar14->type == YAML_TAG_TOKEN) {
          local_c0 = (pyVar14->data).tag.handle;
          local_c8 = (pyVar14->data).tag.suffix;
          tag_mark.column = (pyVar14->start_mark).column;
          tag_mark.index = (pyVar14->start_mark).index;
          tag_mark.line = (pyVar14->start_mark).line;
          end_mark.column = (pyVar14->end_mark).column;
          end_mark.index = (pyVar14->end_mark).index;
          end_mark.line = (pyVar14->end_mark).line;
          parser->token_available = 0;
          parser->tokens_parsed = parser->tokens_parsed + 1;
          parser->stream_end_produced = 0;
          (parser->tokens).head = pyVar14 + 1;
          iVar8 = yaml_parser_fetch_more_tokens(parser);
          if ((iVar8 != 0) && (pyVar14 = (parser->tokens).head, pyVar14 != (yaml_token_t *)0x0))
          goto LAB_0010bce4;
          goto LAB_0010bc9a;
        }
LAB_0010bcca:
        bVar10 = 0;
        __dest = (yaml_char_t *)0x0;
        local_c8 = (yaml_char_t *)0x0;
        uVar12 = 1;
      }
      else {
        bVar10 = 0;
        __dest = (yaml_char_t *)0x0;
        local_c8 = (yaml_char_t *)0x0;
        ptr = (yaml_version_directive_t *)0x0;
      }
LAB_0010bb97:
      yVar2 = pyVar14->type;
      if ((indentless_sequence == 0) || (yVar2 != YAML_BLOCK_ENTRY_TOKEN)) {
        if (yVar2 == YAML_FLOW_SEQUENCE_START_TOKEN) {
          end_mark.column = (pyVar14->end_mark).column;
          end_mark.index = (pyVar14->end_mark).index;
          end_mark.line = (pyVar14->end_mark).line;
          parser->state = YAML_PARSE_FLOW_SEQUENCE_FIRST_ENTRY_STATE;
          *(undefined8 *)event = 0;
          (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
          *(undefined8 *)((long)&event->data + 0x28) = 0;
          (event->data).scalar.length = 0;
          *(undefined8 *)((long)&event->data + 0x20) = 0;
          (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
          (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
          event->type = YAML_SEQUENCE_START_EVENT;
        }
        else {
          if (yVar2 != YAML_FLOW_MAPPING_START_TOKEN) {
            if (yVar2 == YAML_SCALAR_TOKEN) {
              sVar4 = (pyVar14->end_mark).column;
              sVar6 = (pyVar14->end_mark).index;
              sVar7 = (pyVar14->end_mark).line;
              uVar12 = 0;
              iVar8 = 1;
              if (((~bVar10 & (pyVar14->data).scalar.style == YAML_PLAIN_SCALAR_STYLE) == 0) &&
                 (((bVar10 == 0 || (*__dest != '!')) || (uVar12 = 0, __dest[1] != '\0')))) {
                uVar12 = (uint)(bVar10 ^ 1);
                iVar8 = 0;
              }
              pyVar3 = (parser->states).top;
              (parser->states).top = pyVar3 + -1;
              parser->state = pyVar3[-1];
              *(undefined8 *)event = 0;
              (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
              *(undefined8 *)((long)&event->data + 0x28) = 0;
              (event->data).scalar.length = 0;
              *(undefined8 *)((long)&event->data + 0x20) = 0;
              (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
              (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
              event->type = YAML_SCALAR_EVENT;
              (event->start_mark).index = start_mark.index;
              (event->start_mark).line = start_mark.line;
              (event->start_mark).column = start_mark.column;
              (event->end_mark).index = sVar6;
              (event->end_mark).line = sVar7;
              (event->end_mark).column = sVar4;
              (event->data).document_start.version_directive = ptr;
              (event->data).scalar.tag = __dest;
              (event->data).document_start.tag_directives.end =
                   (yaml_tag_directive_t *)(pyVar14->data).alias.value;
              (event->data).scalar.length = (size_t)(pyVar14->data).tag.suffix;
              (event->data).scalar.plain_implicit = iVar8;
              (event->data).scalar.quoted_implicit = uVar12;
              (event->data).scalar.style = (pyVar14->data).scalar.style;
              parser->token_available = 0;
              parser->tokens_parsed = parser->tokens_parsed + 1;
              pyVar14 = (parser->tokens).head;
              parser->stream_end_produced = (uint)(pyVar14->type == YAML_STREAM_END_TOKEN);
              (parser->tokens).head = pyVar14 + 1;
              return 1;
            }
            if ((block == 0) || (yVar2 != YAML_BLOCK_SEQUENCE_START_TOKEN)) {
              if ((block == 0) || (yVar2 != YAML_BLOCK_MAPPING_START_TOKEN)) {
                if ((~bVar10 & ptr == (yaml_version_directive_t *)0x0) == 0) {
                  pyVar9 = (yaml_char_t *)yaml_malloc(1);
                  if (pyVar9 != (yaml_char_t *)0x0) {
                    *pyVar9 = '\0';
                    pyVar3 = (parser->states).top;
                    (parser->states).top = pyVar3 + -1;
                    parser->state = pyVar3[-1];
                    *(undefined8 *)event = 0;
                    (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0
                    ;
                    (event->data).scalar.length = 0;
                    *(undefined8 *)((long)&event->data + 0x20) = 0;
                    *(undefined8 *)((long)&event->data + 0x28) = 0;
                    (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
                    (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
                    event->type = YAML_SCALAR_EVENT;
                    (event->start_mark).index = start_mark.index;
                    (event->start_mark).line = start_mark.line;
                    (event->start_mark).column = start_mark.column;
                    (event->end_mark).index = end_mark.index;
                    (event->end_mark).line = end_mark.line;
                    (event->end_mark).column = end_mark.column;
                    (event->data).document_start.version_directive = ptr;
                    (event->data).scalar.tag = __dest;
                    (event->data).scalar.value = pyVar9;
                    (event->data).scalar.plain_implicit = uVar12;
                    (event->data).scalar.style = YAML_PLAIN_SCALAR_STYLE;
                    goto LAB_0010bddd;
                  }
                  parser->error = YAML_MEMORY_ERROR;
                }
                else {
                  pcVar11 = "while parsing a flow node";
                  if (block != 0) {
                    pcVar11 = "while parsing a block node";
                  }
                  sVar4 = (pyVar14->start_mark).column;
                  sVar6 = (pyVar14->start_mark).index;
                  sVar7 = (pyVar14->start_mark).line;
                  parser->error = YAML_PARSER_ERROR;
                  parser->context = pcVar11;
                  (parser->context_mark).index = start_mark.index;
                  (parser->context_mark).line = start_mark.line;
                  (parser->context_mark).column = start_mark.column;
                  parser->problem = "did not find expected node content";
                  (parser->problem_mark).index = sVar6;
                  (parser->problem_mark).line = sVar7;
                  (parser->problem_mark).column = sVar4;
                  __dest = (yaml_char_t *)0x0;
                  ptr = (yaml_version_directive_t *)0x0;
                }
                local_c0 = (yaml_char_t *)0x0;
                goto LAB_0010bc9f;
              }
              end_mark.column = (pyVar14->end_mark).column;
              end_mark.index = (pyVar14->end_mark).index;
              end_mark.line = (pyVar14->end_mark).line;
              parser->state = YAML_PARSE_BLOCK_MAPPING_FIRST_KEY_STATE;
              *(undefined8 *)event = 0;
              (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
              *(undefined8 *)((long)&event->data + 0x28) = 0;
              (event->data).scalar.length = 0;
              *(undefined8 *)((long)&event->data + 0x20) = 0;
              (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
              (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
              event->type = YAML_MAPPING_START_EVENT;
            }
            else {
              end_mark.column = (pyVar14->end_mark).column;
              end_mark.index = (pyVar14->end_mark).index;
              end_mark.line = (pyVar14->end_mark).line;
              parser->state = YAML_PARSE_BLOCK_SEQUENCE_FIRST_ENTRY_STATE;
              *(undefined8 *)event = 0;
              (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
              *(undefined8 *)((long)&event->data + 0x28) = 0;
              (event->data).scalar.length = 0;
              *(undefined8 *)((long)&event->data + 0x20) = 0;
              (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
              (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
              event->type = YAML_SEQUENCE_START_EVENT;
            }
            (event->start_mark).index = start_mark.index;
            (event->start_mark).line = start_mark.line;
            (event->start_mark).column = start_mark.column;
            (event->end_mark).index = end_mark.index;
            (event->end_mark).line = end_mark.line;
            (event->end_mark).column = end_mark.column;
            (event->data).document_start.version_directive = ptr;
            (event->data).scalar.tag = __dest;
            goto LAB_0010bc08;
          }
          end_mark.column = (pyVar14->end_mark).column;
          end_mark.index = (pyVar14->end_mark).index;
          end_mark.line = (pyVar14->end_mark).line;
          parser->state = YAML_PARSE_FLOW_MAPPING_FIRST_KEY_STATE;
          *(undefined8 *)event = 0;
          (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
          *(undefined8 *)((long)&event->data + 0x28) = 0;
          (event->data).scalar.length = 0;
          *(undefined8 *)((long)&event->data + 0x20) = 0;
          (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
          (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
          event->type = YAML_MAPPING_START_EVENT;
        }
        (event->start_mark).index = start_mark.index;
        (event->start_mark).line = start_mark.line;
        (event->start_mark).column = start_mark.column;
        (event->end_mark).index = end_mark.index;
        (event->end_mark).line = end_mark.line;
        (event->end_mark).column = end_mark.column;
        (event->data).document_start.version_directive = ptr;
        (event->data).scalar.tag = __dest;
        (event->data).sequence_start.implicit = uVar12;
        (event->data).sequence_start.style = YAML_FLOW_SEQUENCE_STYLE;
      }
      else {
        sVar4 = (pyVar14->end_mark).column;
        sVar6 = (pyVar14->end_mark).index;
        sVar7 = (pyVar14->end_mark).line;
        parser->state = YAML_PARSE_INDENTLESS_SEQUENCE_ENTRY_STATE;
        *(undefined8 *)event = 0;
        (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
        *(undefined8 *)((long)&event->data + 0x28) = 0;
        (event->data).scalar.length = 0;
        *(undefined8 *)((long)&event->data + 0x20) = 0;
        (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
        (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
        event->type = YAML_SEQUENCE_START_EVENT;
        (event->start_mark).index = start_mark.index;
        (event->start_mark).line = start_mark.line;
        (event->start_mark).column = start_mark.column;
        (event->end_mark).index = sVar6;
        (event->end_mark).line = sVar7;
        (event->end_mark).column = sVar4;
        (event->data).document_start.version_directive = ptr;
        (event->data).scalar.tag = __dest;
LAB_0010bc08:
        (event->data).sequence_start.implicit = uVar12;
        (event->data).sequence_start.style = YAML_BLOCK_SEQUENCE_STYLE;
      }
    }
LAB_0010bddd:
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

static int
yaml_parser_parse_node(yaml_parser_t *parser, yaml_event_t *event,
        int block, int indentless_sequence)
{
    yaml_token_t *token;
    yaml_char_t *anchor = NULL;
    yaml_char_t *tag_handle = NULL;
    yaml_char_t *tag_suffix = NULL;
    yaml_char_t *tag = NULL;
    yaml_mark_t start_mark, end_mark, tag_mark;
    int implicit;

    token = PEEK_TOKEN(parser);
    if (!token) return 0;

    if (token->type == YAML_ALIAS_TOKEN)
    {
        parser->state = POP(parser, parser->states);
        ALIAS_EVENT_INIT(*event, token->data.alias.value,
                token->start_mark, token->end_mark);
        SKIP_TOKEN(parser);
        return 1;
    }

    else
    {
        start_mark = end_mark = token->start_mark;

        if (token->type == YAML_ANCHOR_TOKEN)
        {
            anchor = token->data.anchor.value;
            start_mark = token->start_mark;
            end_mark = token->end_mark;
            SKIP_TOKEN(parser);
            token = PEEK_TOKEN(parser);
            if (!token) goto error;
            if (token->type == YAML_TAG_TOKEN)
            {
                tag_handle = token->data.tag.handle;
                tag_suffix = token->data.tag.suffix;
                tag_mark = token->start_mark;
                end_mark = token->end_mark;
                SKIP_TOKEN(parser);
                token = PEEK_TOKEN(parser);
                if (!token) goto error;
            }
        }
        else if (token->type == YAML_TAG_TOKEN)
        {
            tag_handle = token->data.tag.handle;
            tag_suffix = token->data.tag.suffix;
            start_mark = tag_mark = token->start_mark;
            end_mark = token->end_mark;
            SKIP_TOKEN(parser);
            token = PEEK_TOKEN(parser);
            if (!token) goto error;
            if (token->type == YAML_ANCHOR_TOKEN)
            {
                anchor = token->data.anchor.value;
                end_mark = token->end_mark;
                SKIP_TOKEN(parser);
                token = PEEK_TOKEN(parser);
                if (!token) goto error;
            }
        }

        if (tag_handle) {
            if (!*tag_handle) {
                tag = tag_suffix;
                yaml_free(tag_handle);
                tag_handle = tag_suffix = NULL;
            }
            else {
                yaml_tag_directive_t *tag_directive;
                for (tag_directive = parser->tag_directives.start;
                        tag_directive != parser->tag_directives.top;
                        tag_directive ++) {
                    if (strcmp((char *)tag_directive->handle, (char *)tag_handle) == 0) {
                        size_t prefix_len = strlen((char *)tag_directive->prefix);
                        size_t suffix_len = strlen((char *)tag_suffix);
                        tag = YAML_MALLOC(prefix_len+suffix_len+1);
                        if (!tag) {
                            parser->error = YAML_MEMORY_ERROR;
                            goto error;
                        }
                        memcpy(tag, tag_directive->prefix, prefix_len);
                        memcpy(tag+prefix_len, tag_suffix, suffix_len);
                        tag[prefix_len+suffix_len] = '\0';
                        yaml_free(tag_handle);
                        yaml_free(tag_suffix);
                        tag_handle = tag_suffix = NULL;
                        break;
                    }
                }
                if (!tag) {
                    yaml_parser_set_parser_error_context(parser,
                            "while parsing a node", start_mark,
                            "found undefined tag handle", tag_mark);
                    goto error;
                }
            }
        }

        implicit = (!tag || !*tag);
        if (indentless_sequence && token->type == YAML_BLOCK_ENTRY_TOKEN) {
            end_mark = token->end_mark;
            parser->state = YAML_PARSE_INDENTLESS_SEQUENCE_ENTRY_STATE;
            SEQUENCE_START_EVENT_INIT(*event, anchor, tag, implicit,
                    YAML_BLOCK_SEQUENCE_STYLE, start_mark, end_mark);
            return 1;
        }
        else {
            if (token->type == YAML_SCALAR_TOKEN) {
                int plain_implicit = 0;
                int quoted_implicit = 0;
                end_mark = token->end_mark;
                if ((token->data.scalar.style == YAML_PLAIN_SCALAR_STYLE && !tag)
                        || (tag && strcmp((char *)tag, "!") == 0)) {
                    plain_implicit = 1;
                }
                else if (!tag) {
                    quoted_implicit = 1;
                }
                parser->state = POP(parser, parser->states);
                SCALAR_EVENT_INIT(*event, anchor, tag,
                        token->data.scalar.value, token->data.scalar.length,
                        plain_implicit, quoted_implicit,
                        token->data.scalar.style, start_mark, end_mark);
                SKIP_TOKEN(parser);
                return 1;
            }
            else if (token->type == YAML_FLOW_SEQUENCE_START_TOKEN) {
                end_mark = token->end_mark;
                parser->state = YAML_PARSE_FLOW_SEQUENCE_FIRST_ENTRY_STATE;
                SEQUENCE_START_EVENT_INIT(*event, anchor, tag, implicit,
                        YAML_FLOW_SEQUENCE_STYLE, start_mark, end_mark);
                return 1;
            }
            else if (token->type == YAML_FLOW_MAPPING_START_TOKEN) {
                end_mark = token->end_mark;
                parser->state = YAML_PARSE_FLOW_MAPPING_FIRST_KEY_STATE;
                MAPPING_START_EVENT_INIT(*event, anchor, tag, implicit,
                        YAML_FLOW_MAPPING_STYLE, start_mark, end_mark);
                return 1;
            }
            else if (block && token->type == YAML_BLOCK_SEQUENCE_START_TOKEN) {
                end_mark = token->end_mark;
                parser->state = YAML_PARSE_BLOCK_SEQUENCE_FIRST_ENTRY_STATE;
                SEQUENCE_START_EVENT_INIT(*event, anchor, tag, implicit,
                        YAML_BLOCK_SEQUENCE_STYLE, start_mark, end_mark);
                return 1;
            }
            else if (block && token->type == YAML_BLOCK_MAPPING_START_TOKEN) {
                end_mark = token->end_mark;
                parser->state = YAML_PARSE_BLOCK_MAPPING_FIRST_KEY_STATE;
                MAPPING_START_EVENT_INIT(*event, anchor, tag, implicit,
                        YAML_BLOCK_MAPPING_STYLE, start_mark, end_mark);
                return 1;
            }
            else if (anchor || tag) {
                yaml_char_t *value = YAML_MALLOC(1);
                if (!value) {
                    parser->error = YAML_MEMORY_ERROR;
                    goto error;
                }
                value[0] = '\0';
                parser->state = POP(parser, parser->states);
                SCALAR_EVENT_INIT(*event, anchor, tag, value, 0,
                        implicit, 0, YAML_PLAIN_SCALAR_STYLE,
                        start_mark, end_mark);
                return 1;
            }
            else {
                yaml_parser_set_parser_error_context(parser,
                        (block ? "while parsing a block node"
                         : "while parsing a flow node"), start_mark,
                        "did not find expected node content", token->start_mark);
                goto error;
            }
        }
    }

error:
    yaml_free(anchor);
    yaml_free(tag_handle);
    yaml_free(tag_suffix);
    yaml_free(tag);

    return 0;
}